

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O2

double CoordAngle(double lat1,double lon1,double lat2,double lon2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  
  auVar8._0_8_ = lon2 * 3.141592653589793;
  auVar8._8_8_ = lon1 * 3.141592653589793;
  dVar1 = (lat1 * 3.141592653589793) / 180.0;
  auVar8 = divpd(auVar8,_DAT_002107b0);
  dVar6 = (lat2 * 3.141592653589793) / 180.0;
  dVar7 = auVar8._0_8_ - auVar8._8_8_;
  dVar2 = cos(dVar1);
  dVar3 = sin(dVar6);
  dVar1 = sin(dVar1);
  dVar4 = cos(dVar6);
  dVar5 = cos(dVar7);
  dVar7 = sin(dVar7);
  dVar6 = cos(dVar6);
  dVar1 = atan2(dVar6 * dVar7,dVar3 * dVar2 - dVar4 * dVar1 * dVar5);
  return ((double)((ulong)dVar1 & -(ulong)(0.0 <= dVar1) |
                  ~-(ulong)(0.0 <= dVar1) & (ulong)(dVar1 + 3.141592653589793 + 3.141592653589793))
         * 180.0) / 3.141592653589793;
}

Assistant:

double CoordAngle (double lat1, double lon1, double lat2, double lon2)
{
    lat1 *= PI; lat1 /= 180.0;              // in-place degree-to-rad conversion
    lon1 *= PI; lon1 /= 180.0;
    lat2 *= PI; lat2 /= 180.0;
    lon2 *= PI; lon2 /= 180.0;
    const double longitudeDifference = lon2 - lon1;
    
    using namespace std;
    const double x = (cos(lat1) * sin(lat2)) -
                     (sin(lat1) * cos(lat2) * cos(longitudeDifference));
    const double y = sin(longitudeDifference) * cos(lat2);
    
    return rad2deg360(atan2(y, x));
}